

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall
wasm::AfterEffectModuleChecker::AfterEffectModuleChecker
          (AfterEffectModuleChecker *this,Module *module)

{
  pointer puVar1;
  bool bVar2;
  Function *in_RAX;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar3;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  this->module = module;
  (this->checkers).
  super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->checkers).
  super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->checkers).
  super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_head_impl = in_RAX;
  for (puVar3 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_38._M_head_impl =
         (puVar3->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::vector<wasm::AfterEffectFunctionChecker,std::allocator<wasm::AfterEffectFunctionChecker>>::
    emplace_back<wasm::Function*>
              ((vector<wasm::AfterEffectFunctionChecker,std::allocator<wasm::AfterEffectFunctionChecker>>
                *)&this->checkers,&local_38._M_head_impl);
  }
  bVar2 = hasAnyStackIR(this);
  this->beganWithAnyStackIR = bVar2;
  return;
}

Assistant:

AfterEffectModuleChecker(Module* module) : module(module) {
    for (auto& func : module->functions) {
      checkers.emplace_back(func.get());
    }
    beganWithAnyStackIR = hasAnyStackIR();
  }